

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdist.c
# Opt level: O1

void qdist_bin__internal(qdist *to,qdist *from,size_t n)

{
  gsize gVar1;
  double *pdVar2;
  double dVar3;
  size_t sVar4;
  gpointer __p;
  qdist_entry *pqVar5;
  qdist_entry *pqVar6;
  gsize gVar7;
  size_t sVar8;
  size_t n_blocks;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  gsize __n;
  
  pqVar5 = (qdist_entry *)g_malloc(0x10);
  to->entries = pqVar5;
  to->size = 1;
  to->n = 0;
  sVar4 = from->n;
  if (sVar4 != 0) {
    n_blocks = n;
    if (sVar4 == 1) {
      n_blocks = sVar4;
    }
    if (n == 0) {
      n_blocks = sVar4;
    }
    dVar3 = from->entries->x;
    auVar11._8_4_ = (int)(n_blocks >> 0x20);
    auVar11._0_8_ = n_blocks;
    auVar11._12_4_ = 0x45300000;
    dVar17 = (*(double *)
               ((long)&from->entries->x + ((long)((sVar4 << 0x20) + -0x100000000) >> 0x1c)) - dVar3)
             / ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)n_blocks) - 4503599627370496.0));
    if (n_blocks == sVar4) {
      pqVar6 = from->entries;
      sVar8 = 0;
      while( true ) {
        auVar14._8_4_ = (int)(sVar8 >> 0x20);
        auVar14._0_8_ = sVar8;
        auVar14._12_4_ = 0x45300000;
        dVar16 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar8) - 4503599627370496.0)) * dVar17 + dVar3;
        if ((pqVar6->x != dVar16) || (NAN(pqVar6->x) || NAN(dVar16))) break;
        sVar8 = sVar8 + 1;
        pqVar6 = pqVar6 + 1;
        if (sVar4 == sVar8) {
          pqVar5 = (qdist_entry *)g_realloc_n(pqVar5,n_blocks,0x10);
          to->entries = pqVar5;
          sVar4 = from->n;
          to->n = sVar4;
          memcpy(pqVar5,from->entries,sVar4 << 4);
          return;
        }
      }
    }
    if (n_blocks != 0) {
      uVar10 = 0;
      gVar7 = 0;
      do {
        auVar15._8_4_ = (int)(gVar7 >> 0x20);
        auVar15._0_8_ = gVar7;
        auVar15._12_4_ = 0x45300000;
        dVar16 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)gVar7) - 4503599627370496.0)) * dVar17 + dVar3;
        gVar1 = gVar7 + 1;
        qdist_add(to,dVar16,0);
        if (uVar10 < from->n) {
          auVar12._8_4_ = (int)(gVar1 >> 0x20);
          auVar12._0_8_ = gVar1;
          auVar12._12_4_ = 0x45300000;
          dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)gVar1) - 4503599627370496.0)) * dVar17 + dVar3;
          uVar9 = uVar10 << 4 | 8;
          do {
            if ((gVar7 != n_blocks - 1) &&
               (pdVar2 = (double *)((long)from->entries + (uVar9 - 8)),
               dVar13 < *pdVar2 || dVar13 == *pdVar2)) break;
            qdist_add(to,dVar16,*(long *)((long)&from->entries->x + uVar9));
            uVar10 = uVar10 + 1;
            uVar9 = uVar9 + 0x10;
          } while (uVar10 < from->n);
        }
        gVar7 = gVar1;
      } while (gVar1 != n_blocks);
    }
  }
  return;
}

Assistant:

void qdist_bin__internal(struct qdist *to, const struct qdist *from, size_t n)
{
    double xmin, xmax;
    double step;
    size_t i, j;

    qdist_init(to);

    if (from->n == 0) {
        return;
    }
    if (n == 0 || from->n == 1) {
        n = from->n;
    }

    /* set equally-sized bins between @from's left and right */
    xmin = qdist_xmin(from);
    xmax = qdist_xmax(from);
    step = (xmax - xmin) / n;

    if (n == from->n) {
        /* if @from's entries are equally spaced, no need to re-bin */
        for (i = 0; i < from->n; i++) {
            if (from->entries[i].x != xmin + i * step) {
                goto rebin;
            }
        }
        /* they're equally spaced, so copy the dist and bail out */
        to->entries = g_renew(struct qdist_entry, to->entries, n);
        to->n = from->n;
        memcpy(to->entries, from->entries, sizeof(*to->entries) * to->n);
        return;
    }

 rebin:
    j = 0;
    for (i = 0; i < n; i++) {
        double x;
        double left, right;

        left = xmin + i * step;
        right = xmin + (i + 1) * step;

        /* Add x, even if it might not get any counts later */
        x = left;
        qdist_add(to, x, 0);

        /*
         * To avoid double-counting we capture [left, right) ranges, except for
         * the righmost bin, which captures a [left, right] range.
         */
        while (j < from->n && (from->entries[j].x < right || i == n - 1)) {
            struct qdist_entry *o = &from->entries[j];

            qdist_add(to, x, o->count);
            j++;
        }
    }
}